

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSC.cpp
# Opt level: O2

void __thiscall CSC::CSC(CSC *this,int r,int c,int nnz,int *p,int *d,double *v)

{
  int i;
  int *__s;
  int *__s_00;
  double *__s_01;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  this->row = r;
  this->col = c;
  this->nonzero = nnz;
  uVar2 = (ulong)(c + 1) << 2;
  if (c < -1) {
    uVar2 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(uVar2);
  lVar3 = 0;
  memset(__s,0,uVar2);
  this->ptr = __s;
  uVar2 = (long)nnz * 4;
  if (nnz < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  uVar1 = (long)nnz * 8;
  if (nnz < 0) {
    uVar1 = 0xffffffffffffffff;
  }
  __s_00 = (int *)operator_new__(uVar2);
  memset(__s_00,0,uVar2);
  this->idx = __s_00;
  __s_01 = (double *)operator_new__(uVar1);
  memset(__s_01,0,uVar1);
  this->val = __s_01;
  for (; lVar3 <= c; lVar3 = lVar3 + 1) {
    __s[lVar3] = p[lVar3];
  }
  uVar1 = 0;
  uVar2 = (ulong)(uint)nnz;
  if (nnz < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    __s_00[uVar1] = d[uVar1];
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    __s_01[uVar1] = v[uVar1];
  }
  return;
}

Assistant:

CSC::CSC(int r, int c, int nnz, int *p, int *d, double *v)
{
    row = r;
    col = c;
    nonzero = nnz;
    ptr = new int[col+1]();
    idx = new int[nonzero]();
    val = new double [nonzero]();

    for (int i = 0; i < col+1; ++i)
    {
      ptr[i] = p[i];
    }
    for (int i = 0; i < nonzero; ++i)
    {
        idx[i] = d[i];
    }
    for (int i = 0; i < nonzero; ++i)
    {
        val[i] = v[i];
    }

 }